

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::SetOneofIndexBase
          (FieldGenerator *this,int index_base)

{
  long lVar1;
  mapped_type *this_00;
  allocator<char> local_49;
  key_type local_48;
  string local_28;
  
  lVar1 = *(long *)(this->descriptor_ + 0x60);
  if (lVar1 != 0) {
    lVar1 = lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40);
    SimpleItoa_abi_cxx11_
              (&local_28,(protobuf *)(ulong)(uint)((int)(lVar1 / -0x30) - index_base),
               (int)(lVar1 % -0x30));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"has_index",&local_49);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->variables_,&local_48);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void FieldGenerator::SetOneofIndexBase(int index_base) {
  if (descriptor_->containing_oneof() != NULL) {
    int index = descriptor_->containing_oneof()->index() + index_base;
    // Flip the sign to mark it as a oneof.
    variables_["has_index"] = SimpleItoa(-index);
  }
}